

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O3

int __thiscall Fl_Input_::replace(Fl_Input_ *this,int b,int e,char *text,int ilen)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  wchar_t local_54;
  wchar_t local_50;
  wchar_t local_4c;
  long local_48;
  char *local_40;
  size_t local_38;
  
  if (b < 1) {
    b = 0;
  }
  was_up_down = 0;
  uVar8 = 0;
  if (0 < e) {
    uVar8 = e;
  }
  uVar9 = this->size_;
  if ((int)uVar9 <= b) {
    b = uVar9;
  }
  uVar3 = uVar9;
  if ((int)uVar8 < (int)uVar9) {
    uVar3 = uVar8;
  }
  uVar4 = uVar3;
  if ((int)uVar8 < b) {
    uVar4 = b;
  }
  uVar16 = (ulong)uVar4;
  uVar5 = b;
  if ((int)uVar8 < b) {
    uVar5 = uVar3;
  }
  uVar14 = (ulong)uVar5;
  if ((int)uVar5 < (int)uVar9 && (0 < (int)uVar5 && uVar3 != b)) {
    uVar17 = (ulong)uVar5;
    do {
      iVar7 = fl_utf8len(this->value_[uVar17]);
      uVar14 = uVar17;
      if (((0 < iVar7) || (uVar14 = uVar17 - 1, uVar16 + 1 == uVar17)) || ((long)uVar17 < 2)) break;
      bVar2 = (long)uVar17 <= (long)this->size_;
      uVar17 = uVar14;
    } while (bVar2);
  }
  iVar7 = fl_utf8len(this->value_[(int)uVar4]);
  uVar17 = (ulong)(uint)this->size_;
  if ((0 < (int)uVar4) && (uVar6 = uVar16, (int)uVar4 < this->size_)) {
    do {
      uVar16 = uVar6;
      if (-1 < iVar7) break;
      uVar16 = uVar6 + 1;
      iVar7 = fl_utf8len(this->value_[uVar6 + 1]);
      uVar17 = (ulong)(uint)this->size_;
      iVar10 = (int)uVar6;
      uVar6 = uVar16;
    } while (iVar10 + 1 < this->size_);
  }
  iVar7 = (int)uVar17;
  if (ilen == 0 && text != (char *)0x0) {
    sVar11 = strlen(text);
    ilen = (int)sVar11;
  }
  iVar15 = (int)uVar16;
  iVar10 = (int)uVar14;
  if (ilen == 0 && iVar15 <= iVar10) {
    return 0;
  }
  local_48 = (long)iVar15;
  if (iVar7 < 1) {
    iVar13 = 0;
  }
  else {
    pcVar18 = this->value_;
    iVar13 = 0;
    pcVar12 = pcVar18;
    do {
      iVar7 = (int)uVar17;
      if (pcVar12 == pcVar18 + iVar10) {
        if (iVar7 <= iVar15) break;
        pcVar12 = pcVar18 + local_48;
      }
      uVar8 = fl_utf8len(*pcVar12);
      uVar16 = (ulong)uVar8;
      if ((int)uVar8 < 2) {
        uVar16 = 1;
      }
      iVar13 = iVar13 + 1;
      pcVar12 = pcVar12 + uVar16;
      pcVar18 = this->value_;
      iVar7 = this->size_;
      uVar17 = (ulong)iVar7;
    } while (pcVar12 < pcVar18 + uVar17);
  }
  uVar8 = 0;
  if ((0 < ilen) && (uVar8 = 0, iVar13 < this->maximum_size_)) {
    uVar8 = 0;
    pcVar18 = text;
    do {
      iVar13 = iVar13 + 1;
      uVar9 = fl_utf8len(*pcVar18);
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      pcVar18 = pcVar18 + uVar9;
      uVar8 = uVar9 + uVar8;
    } while ((pcVar18 < text + ilen) && (iVar13 < this->maximum_size_));
    iVar7 = this->size_;
  }
  put_in_buffer(this,iVar7 + uVar8);
  iVar7 = iVar15 - iVar10;
  if (iVar7 != 0 && iVar10 <= iVar15) {
    if ((undowidget == this) && (iVar10 == undoat)) {
      undobuffersize(undocut + iVar7);
      iVar13 = undocut;
      memcpy(undobuffer + undocut,this->value_ + iVar10,(long)iVar7);
LAB_001bbfb7:
      undocut = iVar7 + iVar13;
      iVar13 = undoinsert;
    }
    else if (undowidget == this) {
      if (iVar15 == undoat && undoinsert == 0) {
        undobuffersize(undocut + iVar7);
        local_40 = undobuffer;
        local_38 = (size_t)undocut;
        memmove(undobuffer + iVar7,undobuffer,local_38);
        memcpy(local_40,this->value_ + iVar10,(long)iVar7);
        iVar13 = (int)local_38;
        goto LAB_001bbfb7;
      }
      if ((iVar15 != undoat) ||
         (iVar13 = undoinsert - iVar7, undoinsert - iVar7 == 0 || undoinsert < iVar7))
      goto LAB_001bbfc9;
    }
    else {
LAB_001bbfc9:
      undobuffersize(iVar7);
      memcpy(undobuffer,this->value_ + iVar10,(long)iVar7);
      undoinsert = 0;
      undocut = iVar7;
      iVar13 = undoinsert;
    }
    undoinsert = iVar13;
    memmove(this->buffer + iVar10,this->buffer + local_48,(long)((this->size_ - iVar15) + 1));
    this->size_ = this->size_ + (iVar10 - iVar15);
    yankcut = 0;
    undowidget = this;
    undoat = iVar10;
    if (((this->super_Fl_Widget).type_ & 7) != 5) {
      yankcut = undocut;
    }
  }
  if (uVar8 != 0) {
    if ((undowidget == this) && (iVar10 == undoat)) {
      undoinsert = undoinsert + uVar8;
    }
    else {
      undocut = 0;
      undoinsert = uVar8;
    }
    memmove(this->buffer + iVar10 + uVar8,this->buffer + iVar10,(long)((this->size_ - iVar10) + 1));
    memcpy(this->buffer + iVar10,text,(ulong)uVar8);
    this->size_ = this->size_ + uVar8;
  }
  iVar7 = this->position_;
  iVar15 = this->mark_;
  iVar13 = iVar10 + uVar8;
  undowidget = this;
  undoat = iVar13;
  this->position_ = iVar13;
  this->mark_ = iVar13;
  if (((this->super_Fl_Widget).type_ & 0x10) == 0) goto LAB_001bc113;
  if (uVar8 == 0) {
    uVar16 = 0;
LAB_001bc18c:
    if ((uint)uVar16 == uVar8) goto LAB_001bc195;
    if (iVar10 < 1) goto LAB_001bc113;
    uVar14 = uVar14 & 0xffffffff;
    do {
      local_4c = L'\0';
      uVar8 = fl_utf8decode(this->value_ + uVar14,this->value_ + this->size_,&local_4c);
      if (uVar8 == 10) goto LAB_001bc113;
      bVar2 = 1 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar2);
  }
  else {
    uVar16 = 0;
    do {
      if (text[uVar16] == ' ') goto LAB_001bc18c;
      uVar16 = uVar16 + 1;
    } while (uVar8 != uVar16);
LAB_001bc195:
    if (iVar10 < 1) goto LAB_001bc113;
    uVar14 = uVar14 & 0xffffffff;
    do {
      local_54 = L'\0';
      uVar8 = fl_utf8decode(this->value_ + uVar14,this->value_ + this->size_,&local_54);
      iVar10 = isspace(uVar8 & 0xff);
      if (iVar10 != 0) goto LAB_001bc113;
      local_50 = L'\0';
      uVar8 = fl_utf8decode(this->value_ + uVar14,this->value_ + this->size_,&local_50);
      if (uVar8 == 10) goto LAB_001bc113;
      bVar2 = 1 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar2);
  }
  uVar14 = 0;
LAB_001bc113:
  iVar10 = (int)uVar14;
  if (iVar15 < (int)uVar14) {
    iVar10 = iVar15;
  }
  if (iVar7 < iVar10) {
    iVar10 = iVar7;
  }
  minimal_update(this,iVar10);
  iVar7 = undoat;
  this->position_ = undoat;
  this->mark_ = iVar7;
  puVar1 = &(this->super_Fl_Widget).flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((this->super_Fl_Widget).when_ & 1) != 0) {
    Fl_Widget::do_callback
              (&this->super_Fl_Widget,&this->super_Fl_Widget,(this->super_Fl_Widget).user_data_);
  }
  return 1;
}

Assistant:

int Fl_Input_::replace(int b, int e, const char* text, int ilen) {
  int ul, om, op;
  was_up_down = 0;

  if (b<0) b = 0;
  if (e<0) e = 0;
  if (b>size_) b = size_;
  if (e>size_) e = size_;
  if (e<b) {int t=b; b=e; e=t;}
  while (b != e && b > 0 && (size_ - b) > 0 &&
       (fl_utf8len((value_ + b)[0]) < 1)) { b--; }
  ul = fl_utf8len((char)(value_ + e)[0]);
  while (e < size_ && e > 0 && ul < 0) {
       e++;
       ul = fl_utf8len((char)(value_ + e)[0]);
  }
  if (text && !ilen) ilen = (int) strlen(text);
  if (e<=b && !ilen) return 0; // don't clobber undo for a null operation

  // we must count UTF-8 *characters* to determine whether we can insert
  // the full text or only a part of it (and how much this would be)

  int nchars = 0;	// characters in value() - deleted + inserted
  const char *p = value_;
  while (p < (char *)(value_+size_)) {
    if (p == (char *)(value_+b)) { // skip removed part
      p = (char *)(value_+e);
      if (p >= (char *)(value_+size_)) break;
    }
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
  }
  int nlen = 0;		// length (in bytes) to be inserted
  p = text;
  while (p < (char *)(text+ilen) && nchars < maximum_size()) {
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
    nlen += ulen;
  }
  ilen = nlen;

  put_in_buffer(size_+ilen);

  if (e>b) {
    if (undowidget == this && b == undoat) {
      undobuffersize(undocut+(e-b));
      memcpy(undobuffer+undocut, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && !undoinsert) {
      undobuffersize(undocut+(e-b));
      memmove(undobuffer+(e-b), undobuffer, undocut);
      memcpy(undobuffer, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && (e-b)<undoinsert) {
      undoinsert -= e-b;
    } else {
      undobuffersize(e-b);
      memcpy(undobuffer, value_+b, e-b);
      undocut = e-b;
      undoinsert = 0;
    }
    memmove(buffer+b, buffer+e, size_-e+1);
    size_ -= e-b;
    undowidget = this;
    undoat = b;
    if (input_type() == FL_SECRET_INPUT) yankcut = 0; else yankcut = undocut;
  }

  if (ilen) {
    if (undowidget == this && b == undoat)
      undoinsert += ilen;
    else {
      undocut = 0;
      undoinsert = ilen;
    }
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, text, ilen);
    size_ += ilen;
  }
  undowidget = this;
  om = mark_;
  op = position_;
  mark_ = position_ = undoat = b+ilen;

  // Insertions into the word at the end of the line will cause it to
  // wrap to the next line, so we must indicate that the changes may start
  // right after the whitespace before the current word.  This will
  // result in sub-optimal update when such wrapping does not happen
  // but it is too hard to figure out for now...
  if (wrap()) {
    // if there is a space in the pasted text, the whole line may have rewrapped
    int i;
    for (i=0; i<ilen; i++)
      if (text[i]==' ') break;
    if (i==ilen)
      while (b > 0 && !isspace(index(b) & 255) && index(b)!='\n') b--;
    else
      while (b > 0 && index(b)!='\n') b--;
  }

  // make sure we redraw the old selection or cursor:
  if (om < b) b = om;
  if (op < b) b = op;

  minimal_update(b);

  mark_ = position_ = undoat;

  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}